

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_dense.c
# Opt level: O0

int SUNLinSolSolve_Dense(SUNLinearSolver S,SUNMatrix A,N_Vector x,N_Vector b,realtype tol)

{
  sunindextype *p;
  sunindextype n;
  realtype **a;
  realtype *b_00;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  sunindextype *pivots;
  realtype *xdata;
  realtype **A_cols;
  N_Vector in_stack_ffffffffffffffa8;
  realtype in_stack_ffffffffffffffb0;
  undefined4 local_4;
  
  if ((((in_RSI == 0) || (in_RDI == (long *)0x0)) || (in_RDX == 0)) || (in_RCX == 0)) {
    local_4 = -0x321;
  }
  else {
    N_VScale(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(N_Vector)0xed8022);
    a = SUNDenseMatrix_Cols((SUNMatrix)in_stack_ffffffffffffffa8);
    b_00 = N_VGetArrayPointer((N_Vector)0xed8056);
    p = *(sunindextype **)(*in_RDI + 8);
    if (((a == (realtype **)0x0) || (b_00 == (realtype *)0x0)) || (p == (sunindextype *)0x0)) {
      *(undefined4 *)(*in_RDI + 0x10) = 0xfffffcdd;
      local_4 = -0x323;
    }
    else {
      n = SUNDenseMatrix_Rows((SUNMatrix)in_stack_ffffffffffffffa8);
      SUNDlsMat_denseGETRS(a,n,p,b_00);
      *(undefined4 *)(*in_RDI + 0x10) = 0;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int SUNLinSolSolve_Dense(SUNLinearSolver S, SUNMatrix A, N_Vector x,
                         N_Vector b, realtype tol)
{
  realtype **A_cols, *xdata;
  sunindextype *pivots;

  if ( (A == NULL) || (S == NULL) || (x == NULL) || (b == NULL) )
    return(SUNLS_MEM_NULL);

  /* copy b into x */
  N_VScale(ONE, b, x);

  /* access data pointers (return with failure on NULL) */
  A_cols = NULL;
  xdata = NULL;
  pivots = NULL;
  A_cols = SUNDenseMatrix_Cols(A);
  xdata = N_VGetArrayPointer(x);
  pivots = PIVOTS(S);
  if ( (A_cols == NULL) || (xdata == NULL)  || (pivots == NULL) ) {
    LASTFLAG(S) = SUNLS_MEM_FAIL;
    return(SUNLS_MEM_FAIL);
  }

  /* solve using LU factors */
  SUNDlsMat_denseGETRS(A_cols, SUNDenseMatrix_Rows(A), pivots, xdata);
  LASTFLAG(S) = SUNLS_SUCCESS;
  return(SUNLS_SUCCESS);
}